

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

void __thiscall SHA256::transform(SHA256 *this,uchar *message,uint block_nb)

{
  uint32 *puVar1;
  uint32 *puVar2;
  long lVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint32 *puVar16;
  uint uVar17;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong local_150;
  uint local_140 [68];
  
  if (0 < (int)block_nb) {
    puVar16 = this->m_h;
    local_150 = (ulong)block_nb;
    local_158 = message + 3;
    iVar11 = 0;
    uVar15 = 0;
    do {
      lVar14 = 0;
      do {
        uVar12 = *(uint *)(message + 3 + lVar14 * 4 + (long)iVar11 + -3);
        local_140[lVar14 + 2] =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x10);
      lVar14 = 0x10;
      uVar12 = local_140[2];
      do {
        uVar17 = *(uint *)((long)&local_178 + lVar14 * 4 + 4);
        uVar4 = local_140[lVar14];
        local_140[lVar14 + 2] =
             (uVar17 >> 3 ^ (uVar17 << 0xe | uVar17 >> 0x12) ^ (uVar17 << 0x19 | uVar17 >> 7)) +
             uVar12 + (uVar4 >> 10 ^ (uVar4 << 0xd | uVar4 >> 0x13) ^ (uVar4 << 0xf | uVar4 >> 0x11)
                      ) + *(int *)((long)&local_158 + lVar14 * 4 + 4);
        lVar14 = lVar14 + 1;
        uVar12 = uVar17;
      } while (lVar14 != 0x40);
      local_178 = *(undefined8 *)puVar16;
      uStack_170 = *(undefined8 *)(this->m_h + 2);
      local_168 = *(undefined8 *)(this->m_h + 4);
      uVar10 = *(undefined8 *)(this->m_h + 6);
      uStack_160 = uVar10;
      uStack_160._4_4_ = (uint)((ulong)uVar10 >> 0x20);
      local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
      uStack_160._0_4_ = (uint)uVar10;
      local_178._4_4_ = (uint)((ulong)local_178 >> 0x20);
      uStack_170._4_4_ = (uint)((ulong)uStack_170 >> 0x20);
      lVar14 = 0;
      do {
        uVar12 = (uint)uStack_170;
        uStack_170._0_4_ = local_178._4_4_;
        local_178._4_4_ = (uint)local_178;
        uVar17 = (uint)uStack_160;
        uStack_160._0_4_ = local_168._4_4_;
        local_168._4_4_ = (uint)local_168;
        iVar13 = ((local_168._4_4_ << 7 | local_168._4_4_ >> 0x19) ^
                 (local_168._4_4_ << 0x15 | local_168._4_4_ >> 0xb) ^
                 (local_168._4_4_ << 0x1a | local_168._4_4_ >> 6)) + uStack_160._4_4_ +
                 *(int *)((long)sha256_k + lVar14) +
                 (((uint)uStack_160 ^ uVar17) & local_168._4_4_ ^ uVar17) +
                 *(int *)((long)local_140 + lVar14 + 8);
        local_168._0_4_ = uStack_170._4_4_ + iVar13;
        local_178._0_4_ =
             (uVar12 & (uint)uStack_170 ^ (uVar12 ^ (uint)uStack_170) & local_178._4_4_) +
             ((local_178._4_4_ << 10 | local_178._4_4_ >> 0x16) ^
             (local_178._4_4_ << 0x13 | local_178._4_4_ >> 0xd) ^
             (local_178._4_4_ << 0x1e | local_178._4_4_ >> 2)) + iVar13;
        lVar14 = lVar14 + 4;
        uStack_160._4_4_ = uVar17;
        uStack_170._4_4_ = uVar12;
      } while (lVar14 != 0x100);
      uStack_160 = CONCAT44(uVar17,(uint)uStack_160);
      uStack_170 = CONCAT44(uVar12,(uint)uStack_170);
      lVar14 = 0;
      do {
        puVar1 = puVar16 + lVar14;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        lVar3 = lVar14 * 4;
        iVar13 = *(int *)((long)&local_178 + lVar3 + 4);
        iVar8 = *(int *)((long)&uStack_170 + lVar3);
        iVar9 = *(int *)((long)&uStack_170 + lVar3 + 4);
        puVar2 = puVar16 + lVar14;
        *puVar2 = *puVar1 + *(int *)((long)&local_178 + lVar3);
        puVar2[1] = uVar5 + iVar13;
        puVar2[2] = uVar6 + iVar8;
        puVar2[3] = uVar7 + iVar9;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 8);
      uVar15 = uVar15 + 1;
      iVar11 = iVar11 + 0x40;
    } while (uVar15 != block_nb);
  }
  return;
}

Assistant:

void SHA256::transform(const unsigned char *message, unsigned int block_nb)
{
    uint32 w[64];
    uint32 wv[8];
    uint32 t1, t2;
    const unsigned char *sub_block;
    int i;
    int j;
    for (i = 0; i < (int) block_nb; i++) {
        sub_block = message + (i << 6);
        for (j = 0; j < 16; j++) {
            SHA2_PACK32(&sub_block[j << 2], &w[j]);
        }
        for (j = 16; j < 64; j++) {
            w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
        }
        for (j = 0; j < 8; j++) {
            wv[j] = m_h[j];
        }
        for (j = 0; j < 64; j++) {
            t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                + sha256_k[j] + w[j];
            t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
            wv[7] = wv[6];
            wv[6] = wv[5];
            wv[5] = wv[4];
            wv[4] = wv[3] + t1;
            wv[3] = wv[2];
            wv[2] = wv[1];
            wv[1] = wv[0];
            wv[0] = t1 + t2;
        }
        for (j = 0; j < 8; j++) {
            m_h[j] += wv[j];
        }
    }
}